

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray_p.cpp
# Opt level: O0

size_t __thiscall
BamTools::Internal::ByteArray::IndexOf(ByteArray *this,char c,size_t from,size_t to)

{
  const_reference pvVar1;
  size_type sVar2;
  size_type in_RCX;
  ulong in_RDX;
  char in_SIL;
  vector<char,_std::allocator<char>_> *in_RDI;
  size_t i;
  size_t size;
  ulong uVar3;
  ulong local_38;
  
  local_38 = in_RDX;
  uVar3 = in_RCX;
  if (in_RCX == 0) {
    in_RCX = std::vector<char,_std::allocator<char>_>::size(in_RDI);
    uVar3 = in_RCX;
  }
  while( true ) {
    if (uVar3 <= local_38) {
      sVar2 = std::vector<char,_std::allocator<char>_>::size(in_RDI);
      return sVar2;
    }
    pvVar1 = std::vector<char,_std::allocator<char>_>::at(in_RDI,in_RCX);
    if (*pvVar1 == in_SIL) break;
    local_38 = local_38 + 1;
  }
  return local_38;
}

Assistant:

std::size_t ByteArray::IndexOf(const char c, const std::size_t from, const std::size_t to) const
{
    const std::size_t size = ((to == 0) ? m_data.size() : to);
    for (std::size_t i = from; i < size; ++i) {
        if (m_data.at(i) == c) {
            return i;
        }
    }
    return m_data.size();
}